

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_glibcxx_debug.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  pointer pbVar2;
  bool bVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  i injector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  undefined1 local_a8 [32];
  pointer local_88 [2];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"boost","");
  pbVar2 = (pointer)local_78;
  local_88[0] = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"di","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_a8;
  std::__debug::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,__l,(allocator_type *)(local_78 + 0x10));
  lVar1 = -0x40;
  do {
    if (pbVar2 != (pointer)pbVar2[-1].field_2._M_allocated_capacity) {
      operator_delete((pointer)pbVar2[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar2->_M_dataplus)._M_p + 1));
    }
    pbVar2 = pbVar2 + -1;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  local_68._M_allocated_capacity = (size_type)&local_58;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::
  create<std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,
             (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::__debug::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
              *)(local_78 + 0x10));
  bVar3 = (pointer)local_a8._24_8_ != local_88[0];
  std::__debug::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a8);
  std::__debug::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return (int)bVar3;
}

Assistant:

int main() {
  std::vector<std::string> v{"boost", "di"};
  const auto injector = di::make_injector(di::bind<std::string[]>().to(v));
  return !injector.create<std::vector<std::string>>().empty();
}